

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.h
# Opt level: O0

void Abc_SclDumpStats(SC_Man *p,char *pFileName,abctime Time)

{
  int iVar1;
  uint uVar2;
  FILE *__stream;
  char *pcVar3;
  abctime aVar4;
  FILE *pTable;
  abctime Time_local;
  char *pFileName_local;
  SC_Man *p_local;
  
  __stream = fopen(pFileName,"a+");
  iVar1 = strcmp(Abc_SclDumpStats::FileNameOld,p->pNtk->pName);
  if (iVar1 == 0) {
    fprintf(__stream," ");
    iVar1 = Abc_NtkNodeNum(p->pNtk);
    fprintf(__stream,"%.1f ",((double)iVar1 * 100.0) / (double)Abc_SclDumpStats::nNodesOld);
    fprintf(__stream,"%.1f ",((double)(int)p->SumArea * 100.0) / (double)Abc_SclDumpStats::nAreaOld)
    ;
    fprintf(__stream,"%.1f ",
            ((double)(int)p->ReportDelay * 100.0) / (double)Abc_SclDumpStats::nDelayOld);
    aVar4 = Abc_Clock();
    fprintf(__stream,"%.2f",((double)(aVar4 - Abc_SclDumpStats::clk) * 1.0) / 1000000.0);
  }
  else {
    sprintf(Abc_SclDumpStats::FileNameOld,"%s",p->pNtk->pName);
    fprintf(__stream,"\n");
    pcVar3 = Extra_FileNameWithoutPath(p->pNtk->pName);
    fprintf(__stream,"%s ",pcVar3);
    uVar2 = Abc_NtkPiNum(p->pNtk);
    fprintf(__stream,"%d ",(ulong)uVar2);
    uVar2 = Abc_NtkPoNum(p->pNtk);
    fprintf(__stream,"%d ",(ulong)uVar2);
    Abc_SclDumpStats::nNodesOld = Abc_NtkNodeNum(p->pNtk);
    fprintf(__stream,"%d ");
    Abc_SclDumpStats::nAreaOld = (int)p->SumArea;
    fprintf(__stream,"%d ");
    Abc_SclDumpStats::nDelayOld = (int)p->ReportDelay;
    fprintf(__stream,"%d ");
    Abc_SclDumpStats::clk = Abc_Clock();
  }
  fclose(__stream);
  return;
}

Assistant:

static inline void Abc_SclDumpStats( SC_Man * p, char * pFileName, abctime Time )
{
    static char FileNameOld[1000] = {0};
    static int nNodesOld, nAreaOld, nDelayOld;
    static abctime clk = 0;
    FILE * pTable;
    pTable = fopen( pFileName, "a+" );
    if ( strcmp( FileNameOld, p->pNtk->pName ) )
    {
        sprintf( FileNameOld, "%s", p->pNtk->pName );
        fprintf( pTable, "\n" );
        fprintf( pTable, "%s ", Extra_FileNameWithoutPath(p->pNtk->pName) );
        fprintf( pTable, "%d ", Abc_NtkPiNum(p->pNtk) );
        fprintf( pTable, "%d ", Abc_NtkPoNum(p->pNtk) );
        fprintf( pTable, "%d ", (nNodesOld = Abc_NtkNodeNum(p->pNtk)) );
        fprintf( pTable, "%d ", (nAreaOld  = (int)p->SumArea)         );
        fprintf( pTable, "%d ", (nDelayOld = (int)p->ReportDelay)     );
        clk = Abc_Clock();
    }
    else
    {
        fprintf( pTable, " " );
        fprintf( pTable, "%.1f ", 100.0 * Abc_NtkNodeNum(p->pNtk) / nNodesOld );
        fprintf( pTable, "%.1f ", 100.0 * (int)p->SumArea         / nAreaOld  );
        fprintf( pTable, "%.1f ", 100.0 * (int)p->ReportDelay     / nDelayOld );
        fprintf( pTable, "%.2f",  1.0*(Abc_Clock() - clk)/CLOCKS_PER_SEC );
    }
    fclose( pTable );
}